

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  GetterXsYs<unsigned_long_long> *pGVar9;
  GetterXsYs<unsigned_long_long> *pGVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  ImVec2 IVar13;
  double dVar14;
  uint uVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImVec2 IVar27;
  
  pGVar9 = this->Getter1;
  pGVar10 = this->Getter2;
  iVar7 = pGVar9->Count;
  lVar16 = (long)(((pGVar9->Offset + prim + 1) % iVar7 + iVar7) % iVar7) * (long)pGVar9->Stride;
  uVar3 = *(unsigned_long_long *)((long)pGVar9->Xs + lVar16);
  uVar4 = *(unsigned_long_long *)((long)pGVar9->Ys + lVar16);
  iVar7 = this->Transformer->YAxis;
  dVar18 = (double)GImPlot->PixelRange[iVar7].Min.x;
  dVar5 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar17 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) - dVar5) *
                   GImPlot->Mx + dVar18);
  dVar14 = (double)GImPlot->PixelRange[iVar7].Min.y;
  dVar6 = GImPlot->CurrentPlot->YAxis[iVar7].Range.Min;
  fVar20 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) - dVar6) *
                   GImPlot->My[iVar7] + dVar14);
  iVar8 = pGVar10->Count;
  lVar16 = (long)(((prim + 1 + pGVar10->Offset) % iVar8 + iVar8) % iVar8) * (long)pGVar10->Stride;
  uVar3 = *(unsigned_long_long *)((long)pGVar10->Xs + lVar16);
  uVar4 = *(unsigned_long_long *)((long)pGVar10->Ys + lVar16);
  fVar21 = (this->P11).x;
  fVar25 = fVar21 - fVar17;
  IVar19.x = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) - dVar5) *
                     GImPlot->Mx + dVar18);
  fVar23 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) - dVar6) *
                   GImPlot->My[iVar7] + dVar14);
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar24 = (this->P12).x;
  fVar22 = fVar24 - IVar19.x;
  IVar19.y = fVar23;
  fVar26 = fVar21 * fVar20 - fVar17 * fVar1;
  fVar21 = fVar24 * fVar23 - IVar19.x * fVar2;
  fVar24 = fVar25 * (fVar2 - fVar23) - fVar22 * (fVar1 - fVar20);
  IVar27.x = (fVar26 * fVar22 - fVar25 * fVar21) / fVar24;
  IVar27.y = ((fVar2 - fVar23) * fVar26 - (fVar1 - fVar20) * fVar21) / fVar24;
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11->col = this->Col;
  IVar13.y = fVar20;
  IVar13.x = fVar17;
  pIVar11[1].pos = IVar13;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[1].col = this->Col;
  pIVar11[2].pos = IVar27;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[2].col = this->Col;
  pIVar11[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[3].col = this->Col;
  pIVar11[4].pos = IVar19;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar11 + 5;
  puVar12 = DrawList->_IdxWritePtr;
  *puVar12 = DrawList->_VtxCurrentIdx;
  uVar15 = -(uint)(fVar2 < fVar1 && fVar20 < fVar23 || fVar23 < fVar20 && fVar1 < fVar2) & 1;
  puVar12[1] = DrawList->_VtxCurrentIdx + uVar15 + 1;
  puVar12[2] = DrawList->_VtxCurrentIdx + 3;
  puVar12[3] = DrawList->_VtxCurrentIdx + 1;
  puVar12[4] = (uVar15 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar12[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar12 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar17;
  (this->P11).y = fVar20;
  (this->P12).x = IVar19.x;
  (this->P12).y = fVar23;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }